

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::objectivec::GetProtoPackagePrefixExceptionList_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,DAT_004e6340,DAT_004e6348 + DAT_004e6340);
  return in_RDI;
}

Assistant:

std::string GetProtoPackagePrefixExceptionList() {
  return g_prefix_mode.exception_path();
}